

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall TypeTest_TestDepth_Test::TestBody(TypeTest_TestDepth_Test *this)

{
  bool bVar1;
  Entry *pEVar2;
  char *pcVar3;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__x;
  reference pvVar4;
  char *in_R9;
  Entry EVar5;
  optional<wasm::HeapType> other;
  AssertHelper local_4e8;
  Message local_4e0;
  unsigned_long local_4d8;
  unsigned_long local_4d0;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_16;
  Message local_4b0;
  unsigned_long local_4a8;
  unsigned_long local_4a0;
  undefined1 local_498 [8];
  AssertionResult gtest_ar_15;
  Message local_480;
  unsigned_long local_478;
  unsigned_long local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_14;
  Message local_450;
  uint local_444;
  unsigned_long local_440;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_13;
  Message local_420;
  uint local_414;
  unsigned_long local_410;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_12;
  Message local_3f0;
  uint local_3e4;
  unsigned_long local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_11;
  Message local_3c0;
  uint local_3b4;
  uintptr_t local_3b0;
  Continuation local_3a8;
  HeapType local_3a0;
  unsigned_long local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar_10;
  Message local_378;
  uint local_36c;
  unsigned_long local_368;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_9;
  Message local_348;
  uint local_33c;
  unsigned_long local_338;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_8;
  Message local_318;
  uint local_30c;
  unsigned_long local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_7;
  Message local_2e8;
  uint local_2dc;
  unsigned_long local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_6;
  Message local_2b8;
  uint local_2ac;
  unsigned_long local_2a8;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_5;
  Message local_288;
  uint local_27c;
  unsigned_long local_278;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_4;
  Message local_258;
  uint local_24c;
  unsigned_long local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_3;
  Message local_228;
  uint local_21c;
  unsigned_long local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_2;
  Message local_1f8;
  uint local_1ec;
  unsigned_long local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  uint local_1bc;
  unsigned_long local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> built;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Type local_110;
  Field local_108;
  Array local_f8;
  Entry local_e8;
  undefined1 local_d8 [12];
  Entry local_c8;
  Struct local_b8 [2];
  Entry local_88;
  Struct local_78;
  TypeBuilder local_58;
  TypeBuilder builder;
  Type local_48;
  Signature local_40;
  HeapType local_30;
  HeapType sig;
  HeapType C;
  HeapType B;
  HeapType A;
  TypeTest_TestDepth_Test *this_local;
  
  ::wasm::HeapType::HeapType(&B);
  ::wasm::HeapType::HeapType(&C);
  ::wasm::HeapType::HeapType(&sig);
  ::wasm::Type::Type(&local_48,none);
  ::wasm::Type::Type((Type *)&builder,none);
  ::wasm::Signature::Signature
            (&local_40,local_48,
             (Type)builder.impl._M_t.
                   super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                   .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl);
  ::wasm::HeapType::HeapType(&local_30,local_40);
  ::wasm::TypeBuilder::TypeBuilder(&local_58,3);
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(&local_78);
  local_88 = ::wasm::TypeBuilder::operator[](&local_58,0);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_88,true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_78);
  ::wasm::Struct::~Struct(&local_78);
  local_b8[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::wasm::Struct::Struct(local_b8);
  local_c8 = ::wasm::TypeBuilder::operator[](&local_58,1);
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen(&local_c8,true);
  local_e8 = ::wasm::TypeBuilder::operator[](&local_58,0);
  std::optional<wasm::HeapType>::optional<wasm::TypeBuilder::Entry,_true>
            ((optional<wasm::HeapType> *)local_d8,&local_e8);
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_payload =
       (_Storage<wasm::HeapType,_true>)local_d8._0_8_;
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_d8[8];
  other.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::HeapType>._9_3_ = local_d8._9_3_;
  pEVar2 = ::wasm::TypeBuilder::Entry::subTypeOf(pEVar2,other);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,local_b8);
  ::wasm::Struct::~Struct(local_b8);
  ::wasm::Type::Type(&local_110,i32);
  ::wasm::Field::Field(&local_108,local_110,Immutable);
  ::wasm::Array::Array(&local_f8,local_108);
  EVar5 = ::wasm::TypeBuilder::operator[](&local_58,2);
  result.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar5.builder;
  pEVar2 = ::wasm::TypeBuilder::Entry::setOpen
                     ((Entry *)((long)&result.
                                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                       .
                                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                               + 0x18),true);
  ::wasm::TypeBuilder::Entry::operator=(pEVar2,&local_f8);
  ::wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_150,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_150,(AssertionResult *)0x4945b1,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
               ,0x667,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  if (bVar1) {
    __x = ::wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,__x);
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    B.id = pvVar4->id;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    C.id = pvVar4->id;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,2);
    sig.id = pvVar4->id;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  ::wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  ::wasm::TypeBuilder::~TypeBuilder(&local_58);
  if (bVar1) {
    local_1b8 = ::wasm::HeapType::getDepth();
    local_1bc = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_1b0,"HeapTypes::any.getDepth()","0U",&local_1b8,&local_1bc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
    if (!bVar1) {
      testing::Message::Message(&local_1c8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x66f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_1c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
    local_1e8 = ::wasm::HeapType::getDepth();
    local_1ec = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_1e0,"HeapTypes::eq.getDepth()","1U",&local_1e8,&local_1ec);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
    if (!bVar1) {
      testing::Message::Message(&local_1f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x670,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
    local_218 = ::wasm::HeapType::getDepth();
    local_21c = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_210,"HeapTypes::array.getDepth()","2U",&local_218,&local_21c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x671,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    local_248 = ::wasm::HeapType::getDepth();
    local_24c = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_240,"HeapTypes::struct_.getDepth()","2U",&local_248,&local_24c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x672,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_258);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    local_278 = ::wasm::HeapType::getDepth();
    local_27c = 3;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_270,"A.getDepth()","3U",&local_278,&local_27c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
    if (!bVar1) {
      testing::Message::Message(&local_288);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x673,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_288);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_288);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
    local_2a8 = ::wasm::HeapType::getDepth();
    local_2ac = 4;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_2a0,"B.getDepth()","4U",&local_2a8,&local_2ac);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
    if (!bVar1) {
      testing::Message::Message(&local_2b8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x674,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_2b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
    local_2d8 = ::wasm::HeapType::getDepth();
    local_2dc = 3;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_2d0,"C.getDepth()","3U",&local_2d8,&local_2dc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2e8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x675,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_2e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    local_308 = ::wasm::HeapType::getDepth();
    local_30c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_300,"HeapTypes::func.getDepth()","0U",&local_308,&local_30c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x678,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
    local_338 = ::wasm::HeapType::getDepth();
    local_33c = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_330,"sig.getDepth()","1U",&local_338,&local_33c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
    if (!bVar1) {
      testing::Message::Message(&local_348);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x679,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_348);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_348);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    local_368 = ::wasm::HeapType::getDepth();
    local_36c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_360,"HeapTypes::cont.getDepth()","0U",&local_368,&local_36c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
    if (!bVar1) {
      testing::Message::Message(&local_378);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x67c,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_378);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_378);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
    local_3b0 = local_30.id;
    ::wasm::Continuation::Continuation(&local_3a8,local_30);
    ::wasm::HeapType::HeapType(&local_3a0,local_3a8);
    local_398 = ::wasm::HeapType::getDepth();
    local_3b4 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_390,"HeapType(Continuation(sig)).getDepth()","1U",&local_398,
               &local_3b4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
    if (!bVar1) {
      testing::Message::Message(&local_3c0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x67d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_3c0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_3c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
    local_3e0 = ::wasm::HeapType::getDepth();
    local_3e4 = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_3d8,"HeapTypes::ext.getDepth()","0U",&local_3e0,&local_3e4);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
    if (!bVar1) {
      testing::Message::Message(&local_3f0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x67f,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_3f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_3f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
    local_410 = ::wasm::HeapType::getDepth();
    local_414 = 2;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_408,"HeapTypes::i31.getDepth()","2U",&local_410,&local_414);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x681,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_420);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
      testing::Message::~Message(&local_420);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
    local_440 = ::wasm::HeapType::getDepth();
    local_444 = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_438,"HeapTypes::string.getDepth()","1U",&local_440,&local_444);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
    if (!bVar1) {
      testing::Message::Message(&local_450);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x682,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_450);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
      testing::Message::~Message(&local_450);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
    local_470 = ::wasm::HeapType::getDepth();
    local_478 = 0xffffffffffffffff;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_468,"HeapTypes::none.getDepth()","size_t(-1)",&local_470,&local_478
              );
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
    if (!bVar1) {
      testing::Message::Message(&local_480);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x684,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_480);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
      testing::Message::~Message(&local_480);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
    local_4a0 = ::wasm::HeapType::getDepth();
    local_4a8 = 0xffffffffffffffff;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_498,"HeapTypes::nofunc.getDepth()","size_t(-1)",&local_4a0,
               &local_4a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_498);
    if (!bVar1) {
      testing::Message::Message(&local_4b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_498);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x685,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
      testing::Message::~Message(&local_4b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_498);
    local_4d0 = ::wasm::HeapType::getDepth();
    local_4d8 = 0xffffffffffffffff;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
              ((EqHelper *)local_4c8,"HeapTypes::noext.getDepth()","size_t(-1)",&local_4d0,
               &local_4d8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
    if (!bVar1) {
      testing::Message::Message(&local_4e0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
      testing::internal::AssertHelper::AssertHelper
                (&local_4e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x686,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
      testing::internal::AssertHelper::~AssertHelper(&local_4e8);
      testing::Message::~Message(&local_4e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  }
  return;
}

Assistant:

TEST_F(TypeTest, TestDepth) {
  HeapType A, B, C;
  HeapType sig = HeapType(Signature(Type::none, Type::none));
  {
    TypeBuilder builder(3);
    builder[0].setOpen() = Struct();
    builder[1].setOpen().subTypeOf(builder[0]) = Struct();
    builder[2].setOpen() = Array(Field(Type::i32, Immutable));
    auto result = builder.build();
    ASSERT_TRUE(result);
    auto built = *result;
    A = built[0];
    B = built[1];
    C = built[2];
  }

  // any :> eq :> array :> specific array types
  EXPECT_EQ(HeapTypes::any.getDepth(), 0U);
  EXPECT_EQ(HeapTypes::eq.getDepth(), 1U);
  EXPECT_EQ(HeapTypes::array.getDepth(), 2U);
  EXPECT_EQ(HeapTypes::struct_.getDepth(), 2U);
  EXPECT_EQ(A.getDepth(), 3U);
  EXPECT_EQ(B.getDepth(), 4U);
  EXPECT_EQ(C.getDepth(), 3U);

  // Signature types are subtypes of func.
  EXPECT_EQ(HeapTypes::func.getDepth(), 0U);
  EXPECT_EQ(sig.getDepth(), 1U);

  // Continuation types are subtypes of cont.
  EXPECT_EQ(HeapTypes::cont.getDepth(), 0U);
  EXPECT_EQ(HeapType(Continuation(sig)).getDepth(), 1U);

  EXPECT_EQ(HeapTypes::ext.getDepth(), 0U);

  EXPECT_EQ(HeapTypes::i31.getDepth(), 2U);
  EXPECT_EQ(HeapTypes::string.getDepth(), 1U);

  EXPECT_EQ(HeapTypes::none.getDepth(), size_t(-1));
  EXPECT_EQ(HeapTypes::nofunc.getDepth(), size_t(-1));
  EXPECT_EQ(HeapTypes::noext.getDepth(), size_t(-1));
}